

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O1

exr_result_t
exr_attr_list_add_by_type
          (exr_context_t ctxt,exr_attribute_list_t *list,char *name,char *type,int32_t data_len,
          uint8_t **data_ptr,exr_attribute_t **attr)

{
  exr_attribute_t *peVar1;
  exr_attribute_t **ppeVar2;
  exr_result_t eVar3;
  int iVar4;
  char *pcVar5;
  code *UNRECOVERED_JUMPTABLE;
  long lVar6;
  ulong uVar7;
  undefined8 *puVar8;
  exr_attribute_t *nattr;
  uint8_t **local_58;
  size_t local_50;
  exr_attribute_t **local_48;
  size_t local_40;
  exr_attribute_list_t *local_38;
  
  nattr = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((type == (char *)0x0) || (*type == '\0')) {
    eVar3 = (**(code **)(ctxt + 0x40))(ctxt,3,"Invalid type to add_by_type");
    return eVar3;
  }
  local_38 = list;
  eVar3 = validate_attr_arguments((_internal_exr_context *)ctxt,list,name,data_len,data_ptr,attr);
  if (eVar3 != 0) {
    if (-1 < eVar3) {
      return eVar3;
    }
    peVar1 = *attr;
    iVar4 = strcmp(type,peVar1->type_name);
    if (iVar4 == 0) {
      return 0;
    }
    *attr = (exr_attribute_t *)0x0;
    nattr = peVar1;
    eVar3 = (**(code **)(ctxt + 0x48))
                      (ctxt,3,
                       "Entry \'%s\' already in list but with different type (\'%s\' vs requested \'%s\')"
                       ,name,peVar1->type_name,type);
    return eVar3;
  }
  local_58 = data_ptr;
  local_50 = strlen(name);
  uVar7 = (ulong)(byte)ctxt[2];
  if (uVar7 < local_50) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x48);
    pcVar5 = "Provided name \'%s\' too long for file (len %d, max %d)";
LAB_0011190e:
    eVar3 = (*UNRECOVERED_JUMPTABLE)(ctxt,0xc,pcVar5,name,local_50 & 0xffffffff,uVar7);
    return eVar3;
  }
  local_40 = local_50;
  local_50 = strlen(type);
  if (uVar7 < local_50) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x48);
    pcVar5 = "Provided type name \'%s\' too long for file (len %d, max %d)";
    name = type;
    goto LAB_0011190e;
  }
  local_48 = attr;
  lVar6 = 0;
  do {
    iVar4 = strcmp(type,*(char **)((long)&the_predefined_attr_typenames[0].name + lVar6));
    ppeVar2 = local_48;
    if (iVar4 == 0) {
      puVar8 = (undefined8 *)((long)&the_predefined_attr_typenames[0].name + lVar6);
      goto LAB_00111968;
    }
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x2a0);
  puVar8 = (undefined8 *)0x0;
LAB_00111968:
  if (puVar8 == (undefined8 *)0x0) {
    pcVar5 = (char *)(ulong)(uint)data_len;
    eVar3 = create_attr_block((_internal_exr_context *)ctxt,&nattr,0x38,data_len,local_58,name,
                              (int32_t)local_40,type,(int32_t)local_50);
    if (eVar3 != 0) goto LAB_001119fc;
    pcVar5 = (char *)0x1d;
  }
  else {
    pcVar5 = (char *)(ulong)(uint)data_len;
    eVar3 = create_attr_block((_internal_exr_context *)ctxt,&nattr,puVar8[2],data_len,local_58,name,
                              (int32_t)local_40,(char *)0x0,0);
    if (eVar3 != 0) goto LAB_001119fc;
    nattr->type_name = (char *)*puVar8;
    nattr->type_name_length = *(uint8_t *)(puVar8 + 1);
    pcVar5 = (char *)(ulong)*(uint *)((long)puVar8 + 0xc);
  }
  nattr->type = (exr_attribute_type_t)pcVar5;
  eVar3 = 0;
LAB_001119fc:
  if (eVar3 == 0) {
    eVar3 = add_to_list((_internal_exr_context *)ctxt,local_38,nattr,pcVar5);
  }
  if (eVar3 == 0) {
    *ppeVar2 = nattr;
    check_attr_handler((_internal_exr_context *)ctxt,nattr);
  }
  else if (local_58 != (uint8_t **)0x0) {
    *local_58 = (uint8_t *)0x0;
  }
  return eVar3;
}

Assistant:

exr_result_t
exr_attr_list_add_by_type (
    exr_context_t         ctxt,
    exr_attribute_list_t* list,
    const char*           name,
    const char*           type,
    int32_t               data_len,
    uint8_t**             data_ptr,
    exr_attribute_t**     attr)
{
    const struct _internal_exr_attr_map* known = NULL;

    exr_result_t     rval = EXR_ERR_INVALID_ARGUMENT;
    int32_t          nlen, tlen, mlen;
    size_t           slen;
    exr_attribute_t* nattr = NULL;

    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (!type || type[0] == '\0')
    {
        return pctxt->report_error (
            pctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid type to add_by_type");
    }

    rval =
        validate_attr_arguments (pctxt, list, name, data_len, data_ptr, attr);
    if (rval != EXR_ERR_SUCCESS)
    {
        if (rval < 0)
        {
            if (0 != strcmp (type, (*attr)->type_name))
            {
                nattr = *attr;
                *attr = NULL;
                return pctxt->print_error (
                    pctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Entry '%s' already in list but with different type ('%s' vs requested '%s')",
                    name,
                    nattr->type_name,
                    type);
            }
            return EXR_ERR_SUCCESS;
        }
        return rval;
    }

    slen = strlen (name);
    mlen = (int32_t) pctxt->max_name_length;

    if (slen > (size_t) mlen)
    {
        return pctxt->print_error (
            pctxt,
            EXR_ERR_NAME_TOO_LONG,
            "Provided name '%s' too long for file (len %d, max %d)",
            name,
            (int) slen,
            mlen);
    }
    nlen = (int32_t) slen;

    slen = strlen (type);
    if (slen > (size_t) mlen)
    {
        return pctxt->print_error (
            pctxt,
            EXR_ERR_NAME_TOO_LONG,
            "Provided type name '%s' too long for file (len %d, max %d)",
            type,
            (int) slen,
            mlen);
    }
    tlen = (int32_t) slen;

    for (int i = 0; i < the_predefined_attr_count; ++i)
    {
        if (0 == strcmp (type, the_predefined_attr_typenames[i].name))
        {
            known = &(the_predefined_attr_typenames[i]);
            break;
        }
    }

    if (known)
    {
        rval = create_attr_block (
            pctxt,
            &nattr,
            known->exp_size,
            data_len,
            data_ptr,
            name,
            nlen,
            NULL,
            0);

        if (rval == EXR_ERR_SUCCESS)
        {
            nattr->type_name        = known->name;
            nattr->type_name_length = (uint8_t) known->name_len;
            nattr->type             = known->type;
        }
    }
    else
    {
        rval = create_attr_block (
            pctxt,
            &nattr,
            sizeof (exr_attr_opaquedata_t),
            data_len,
            data_ptr,
            name,
            nlen,
            type,
            tlen);

        if (rval == EXR_ERR_SUCCESS) nattr->type = EXR_ATTR_OPAQUE;
    }
    if (rval == EXR_ERR_SUCCESS) rval = add_to_list (pctxt, list, nattr, name);
    if (rval == EXR_ERR_SUCCESS)
    {
        *attr = nattr;
        check_attr_handler (pctxt, nattr);
    }
    else if (data_ptr)
        *data_ptr = NULL;

    return rval;
}